

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O1

void pzshape::TPZShapePrism::SideShape
               (int side,TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  if (0x14 < (uint)side) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZCompElPr3d::SideShapeFunction. Bad paramenter side.\n",0x37
              );
    return;
  }
  if (side == 0x14) {
    Shape(pt,id,order,phi,dphi);
    return;
  }
  if (side < 6) {
    TPZShapePoint::Shape(pt,id,order,phi,dphi);
    return;
  }
  if (side < 0xf) {
    TPZShapeLinear::Shape(pt,id,order,phi,dphi);
    return;
  }
  if ((side != 0x13) && (side != 0xf)) {
    TPZShapeQuad::Shape(pt,id,order,phi,dphi);
    return;
  }
  TPZShapeTriang::Shape(pt,id,order,phi,dphi);
  return;
}

Assistant:

void TPZShapePrism::SideShape(int side, TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		if(side<0 || side>20) PZError << "TPZCompElPr3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==20) {
			Shape(pt,id,order,phi,dphi);
		} else if(side<6) {
			TPZShapePoint::Shape(pt,id,order,phi,dphi);
		} else if(side < 15) {
			TPZShapeLinear::Shape(pt,id,order,phi,dphi);
		} else if(side == 15 || side == 19) {
			TPZShapeTriang::Shape(pt,id,order,phi,dphi);
		} else {
			TPZShapeQuad::Shape(pt,id,order,phi,dphi);
		}
	}